

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O0

bool bssl::tls1_parse_peer_sigalgs(SSL_HANDSHAKE *hs,CBS *in_sigalgs)

{
  uint16_t uVar1;
  size_t sVar2;
  bool local_21;
  CBS *in_sigalgs_local;
  SSL_HANDSHAKE *hs_local;
  
  uVar1 = ssl_protocol_version(hs->ssl);
  if (uVar1 < 0x303) {
    hs_local._7_1_ = true;
  }
  else {
    sVar2 = CBS_len(in_sigalgs);
    local_21 = false;
    if (sVar2 != 0) {
      local_21 = parse_u16_array(in_sigalgs,&hs->peer_sigalgs);
    }
    hs_local._7_1_ = local_21;
  }
  return hs_local._7_1_;
}

Assistant:

bool tls1_parse_peer_sigalgs(SSL_HANDSHAKE *hs, const CBS *in_sigalgs) {
  // Extension ignored for inappropriate versions
  if (ssl_protocol_version(hs->ssl) < TLS1_2_VERSION) {
    return true;
  }

  // In all contexts, the signature algorithms list may not be empty. (It may be
  // omitted by clients in TLS 1.2, but then the entire extension is omitted.)
  return CBS_len(in_sigalgs) != 0 &&
         parse_u16_array(in_sigalgs, &hs->peer_sigalgs);
}